

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

void mod2sparse_copyrows(mod2sparse *m,mod2sparse *r,int *rows)

{
  int iVar1;
  long extraout_RDX;
  uint uVar2;
  FILE *r_00;
  FILE *pFVar3;
  FILE *pFVar4;
  FILE *__stream;
  ulong uVar5;
  long lVar6;
  mod2entry *pmVar7;
  ulong uStack_88;
  
  r_00 = (FILE *)r;
  pFVar4 = (FILE *)m;
  if (m->n_cols <= r->n_cols) {
    pFVar4 = (FILE *)r;
    mod2sparse_clear(r);
    if (0 < r->n_rows) {
      uVar5 = 0;
      do {
        iVar1 = rows[uVar5];
        if (((long)iVar1 < 0) || (m->n_rows <= iVar1)) {
          mod2sparse_copyrows_cold_1();
          goto LAB_00121bfe;
        }
        for (pmVar7 = m->rows[iVar1].right; -1 < pmVar7->row; pmVar7 = pmVar7->right) {
          r_00 = (FILE *)(uVar5 & 0xffffffff);
          pFVar4 = (FILE *)r;
          mod2sparse_insert(r,(int)uVar5,pmVar7->col);
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)r->n_rows);
    }
    return;
  }
LAB_00121bfe:
  mod2sparse_copyrows_cold_2();
  pFVar3 = r_00;
  __stream = pFVar4;
  if (pFVar4->_flags <= r_00->_flags) {
    __stream = r_00;
    mod2sparse_clear((mod2sparse *)r_00);
    if (0 < *(int *)&r_00->field_0x4) {
      lVar6 = 0;
      do {
        iVar1 = *(int *)(extraout_RDX + lVar6 * 4);
        if (((long)iVar1 < 0) || (*(int *)&pFVar4->field_0x4 <= iVar1)) {
          mod2sparse_copycols_cold_1();
          goto LAB_00121c7d;
        }
        pmVar7 = ((mod2entry *)pFVar4->_IO_read_end)[iVar1].down;
        while( true ) {
          uVar2 = pmVar7->row;
          pFVar3 = (FILE *)(ulong)uVar2;
          if ((int)uVar2 < 0) break;
          __stream = r_00;
          mod2sparse_insert((mod2sparse *)r_00,uVar2,(int)lVar6);
          pmVar7 = pmVar7->down;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < *(int *)&r_00->field_0x4);
    }
    return;
  }
LAB_00121c7d:
  mod2sparse_copycols_cold_2();
  iVar1 = pFVar3->_flags;
  uVar2 = 1;
  uStack_88 = 0x100000000;
  if ((((10 < iVar1) && (uStack_88 = 0x200000000, 100 < iVar1)) &&
      (uStack_88 = 0x300000000, 1000 < iVar1)) && (uStack_88 = 0x400000000, 10000 < iVar1)) {
    uStack_88 = (ulong)((100000 < iVar1) + 5) << 0x20;
  }
  iVar1 = *(int *)&pFVar3->field_0x4;
  if (((10 < iVar1) && (uVar2 = 2, 100 < iVar1)) &&
     ((uVar2 = 3, 1000 < iVar1 && (uVar2 = 4, 10000 < iVar1)))) {
    uVar2 = (100000 < iVar1) + 5;
  }
  if (0 < pFVar3->_flags) {
    uVar5 = 0;
    do {
      fprintf(__stream,"%*d:",uStack_88 >> 0x20,uVar5 & 0xffffffff);
      for (pmVar7 = ((mod2entry *)pFVar3->_IO_read_ptr)[uVar5].right; -1 < pmVar7->row;
          pmVar7 = pmVar7->right) {
        fprintf(__stream," %*d",(ulong)uVar2,(ulong)(uint)pmVar7->col);
      }
      fputc(10,__stream);
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)pFVar3->_flags);
  }
  return;
}

Assistant:

void mod2sparse_copyrows
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *rows		/* Indexes of rows to copy, from 0 */
)
{ 
  mod2entry *e;
  int i;

  if (mod2sparse_cols(m)>mod2sparse_cols(r))
  { fprintf(stderr,
     "mod2sparse_copyrows: Destination matrix has fewer columns than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { if (rows[i]<0 || rows[i]>=mod2sparse_rows(m))
    { fprintf(stderr,"mod2sparse_copyrows: Row index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_row(m,rows[i]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,i,e->col);
      e = mod2sparse_next_in_row(e);
    }
  }
}